

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output
          (VisionFeaturePrint_Objects *this,char *value)

{
  int iVar1;
  Arena *this_00;
  char *pcVar2;
  LogMessage *other;
  long *elem;
  int iVar3;
  Rep *pRVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/../src/../build/format/VisionFeaturePrint.pb.h"
               ,500);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
    iVar3 = (this->output_).super_RepeatedPtrFieldBase.total_size_;
LAB_0019492a:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->output_).super_RepeatedPtrFieldBase,iVar3 + 1);
    pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
    iVar3 = pRVar4->allocated_size;
  }
  else {
    iVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
    iVar3 = pRVar4->allocated_size;
    if (iVar1 < iVar3) {
      (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (long *)pRVar4->elements[iVar1];
      goto LAB_001949be;
    }
    if (iVar3 == (this->output_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0019492a;
  }
  pRVar4->allocated_size = iVar3 + 1;
  this_00 = (this->output_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (long *)operator_new(0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
  }
  else {
    elem = (long *)google::protobuf::Arena::AllocateAligned
                             (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
    pRVar4 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  }
  iVar3 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
  pRVar4->elements[iVar3] = elem;
LAB_001949be:
  pcVar2 = (char *)elem[1];
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)elem,0,pcVar2,(ulong)value);
  return;
}

Assistant:

inline void VisionFeaturePrint_Objects::add_output(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  output_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output)
}